

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclHashCells(SC_Lib *p)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  if (p->nBins != 0) {
    __assert_fail("p->nBins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                  ,0x45,"void Abc_SclHashCells(SC_Lib *)");
  }
  iVar1 = (p->vCells).nSize;
  uVar4 = iVar1 * 5 - 1;
  while( true ) {
    do {
      uVar5 = uVar4 + 1;
      uVar2 = uVar4 & 1;
      uVar4 = uVar5;
    } while (uVar2 != 0);
    if (uVar5 < 9) break;
    iVar6 = 5;
    while (uVar5 % (iVar6 - 2U) != 0) {
      uVar2 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar5 < uVar2) goto LAB_003d92e8;
    }
  }
LAB_003d92e8:
  p->nBins = uVar5;
  piVar3 = (int *)malloc((long)(int)uVar5 << 2);
  memset(piVar3,0xff,(long)(int)uVar5 << 2);
  p->pBins = piVar3;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      piVar3 = Abc_SclHashLookup(p,*(p->vCells).pArray[lVar7]);
      if (*piVar3 != -1) {
        __assert_fail("*pPlace == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                      ,0x4b,"void Abc_SclHashCells(SC_Lib *)");
      }
      *piVar3 = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vCells).nSize);
  }
  return;
}

Assistant:

void Abc_SclHashCells( SC_Lib * p )
{
    SC_Cell * pCell;
    int i, * pPlace;
    assert( p->nBins == 0 );
    p->nBins = Abc_PrimeCudd( 5 * SC_LibCellNum(p) );
    p->pBins = ABC_FALLOC( int, p->nBins );
    SC_LibForEachCell( p, pCell, i )
    {
        pPlace = Abc_SclHashLookup( p, pCell->pName );
        assert( *pPlace == -1 );
        *pPlace = i;
    }
}